

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

int Seg_ManCountIntLevels(Seg_Man_t *p,int iStartVar)

{
  int **ppLevels;
  Gia_Man_t *pGVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  ulong uVar8;
  
  pVVar6 = p->vFirsts;
  uVar7 = p->pGia->nObjs;
  if (pVVar6->nCap < (int)uVar7) {
    if (pVVar6->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar3 = (int *)realloc(pVVar6->pArray,(long)(int)uVar7 << 2);
    }
    pVVar6->pArray = piVar3;
    if (piVar3 == (int *)0x0) goto LAB_007b7c99;
    pVVar6->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset(pVVar6->pArray,0xff,(ulong)uVar7 * 4);
  }
  pVVar6->nSize = uVar7;
  pVVar6 = p->vNvars;
  uVar7 = p->pGia->nObjs;
  if (pVVar6->nCap < (int)uVar7) {
    if (pVVar6->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)(int)uVar7 << 2);
    }
    else {
      piVar3 = (int *)realloc(pVVar6->pArray,(long)(int)uVar7 << 2);
    }
    pVVar6->pArray = piVar3;
    if (piVar3 == (int *)0x0) {
LAB_007b7c99:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar6->nCap = uVar7;
  }
  if (0 < (int)uVar7) {
    memset(pVVar6->pArray,0,(ulong)uVar7 * 4);
  }
  pVVar6->nSize = uVar7;
  ppLevels = &p->pLevels;
  if (p->pLevels != (int *)0x0) {
    free(p->pLevels);
    *ppLevels = (int *)0x0;
  }
  pGVar1 = p->pGia;
  if (pGVar1->pManTime == (void *)0x0) {
    iVar2 = Gia_ManLutLevel(pGVar1,ppLevels);
    p->DelayMax = iVar2;
  }
  else {
    iVar2 = Gia_ManLutLevelWithBoxes(pGVar1);
    p->DelayMax = iVar2;
    pVVar6 = p->pGia->vLevels;
    piVar3 = pVVar6->pArray;
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (int *)0x0;
    p->pLevels = piVar3;
    pGVar1 = p->pGia;
    pVVar6 = pGVar1->vLevels;
    if (pVVar6 != (Vec_Int_t *)0x0) {
      if (pVVar6->pArray != (int *)0x0) {
        free(pVVar6->pArray);
        pGVar1->vLevels->pArray = (int *)0x0;
        pVVar6 = pGVar1->vLevels;
        if (pVVar6 == (Vec_Int_t *)0x0) goto LAB_007b7b33;
      }
      free(pVVar6);
      pGVar1->vLevels = (Vec_Int_t *)0x0;
    }
  }
LAB_007b7b33:
  pGVar1 = p->pGia;
  iVar2 = pGVar1->nObjs;
  if (1 < iVar2) {
    pGVar4 = pGVar1->pObjs;
    lVar5 = 1;
    do {
      pGVar4 = pGVar4 + 1;
      uVar7 = (uint)*(ulong *)pGVar4;
      uVar8 = *(ulong *)pGVar4 & 0x1fffffff;
      if (-1 < (int)uVar7 || uVar8 == 0x1fffffff) {
        if (-1 < (int)uVar7 && (int)uVar8 != 0x1fffffff) {
          if (pGVar1->vMapping->nSize <= lVar5) goto LAB_007b7c5b;
          if (pGVar1->vMapping->pArray[lVar5] == 0) goto LAB_007b7c1e;
        }
        if ((~uVar7 & 0x9fffffff) != 0) {
          if (pGVar1->vMapping->nSize <= lVar5) {
LAB_007b7c5b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (pGVar1->vMapping->pArray[lVar5] == 0) {
            __assert_fail("Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                          ,0x86,"int Seg_ManCountIntLevels(Seg_Man_t *, int)");
          }
        }
        if (p->vFirsts->nSize <= lVar5) {
LAB_007b7c3c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vFirsts->pArray[lVar5] = iStartVar;
        if (p->vNvars->nSize <= lVar5) goto LAB_007b7c3c;
        iVar2 = (*ppLevels)[lVar5];
        if (iVar2 < 2) {
          iVar2 = 0;
        }
        p->vNvars->pArray[lVar5] = iVar2;
        iStartVar = iStartVar + iVar2;
        iVar2 = pGVar1->nObjs;
      }
LAB_007b7c1e:
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  return iStartVar;
}

Assistant:

int Seg_ManCountIntLevels( Seg_Man_t * p, int iStartVar )
{
    Gia_Obj_t * pObj;
    int iLut, nVars;
    Vec_IntFill( p->vFirsts, Gia_ManObjNum(p->pGia), -1 );
    Vec_IntFill( p->vNvars,  Gia_ManObjNum(p->pGia), 0 );
    ABC_FREE( p->pLevels );
    if ( p->pGia->pManTime )
    {
        p->DelayMax = Gia_ManLutLevelWithBoxes( p->pGia );
        p->pLevels = Vec_IntReleaseArray( p->pGia->vLevels );
        Vec_IntFreeP( &p->pGia->vLevels );
    }
    else
        p->DelayMax = Gia_ManLutLevel( p->pGia, &p->pLevels );
    Gia_ManForEachObj1( p->pGia, pObj, iLut )
    {
        if ( Gia_ObjIsCo(pObj) )
            continue;
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        assert( Gia_ObjIsCi(pObj) || Gia_ObjIsLut(p->pGia, iLut) );
        Vec_IntWriteEntry( p->vFirsts, iLut, iStartVar );
        //assert( p->pLevels[iLut] > 0 );
        nVars = p->pLevels[iLut] < 2 ? 0 : p->pLevels[iLut];
        Vec_IntWriteEntry( p->vNvars,  iLut, nVars );
        iStartVar += nVars;
    }
    return iStartVar;
}